

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O3

void printS32ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar3 = MCOperand_getImm(op);
  uVar5 = (uint)uVar3;
  if ((int)uVar5 < 0) {
    uVar3 = (ulong)-uVar5;
    if (uVar5 < 0xfffffff7) {
      pcVar4 = "-0x%x";
    }
    else {
      pcVar4 = "-%u";
    }
  }
  else {
    if (uVar5 < 10) {
      pcVar4 = ", %u";
    }
    else {
      pcVar4 = ", 0x%x";
    }
    pcVar4 = pcVar4 + 2;
    uVar3 = uVar3 & 0xffffffff;
  }
  SStream_concat(O,pcVar4,uVar3);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x16;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1e) =
         (long)(int)uVar5;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printS32ImmOperand(MCInst *MI, int OpNum, SStream *O)
{
	int32_t Value = (int32_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// assert(isInt<32>(Value) && "Invalid s32imm argument");

	if (Value >= 0) {
		if (Value > HEX_THRESHOLD)
			SStream_concat(O, "0x%x", Value);
		else
			SStream_concat(O, "%u", Value);
	} else {
		if (Value < -HEX_THRESHOLD)
			SStream_concat(O, "-0x%x", -Value);
		else
			SStream_concat(O, "-%u", -Value);
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = (int64_t)Value;
		MI->flat_insn->detail->sysz.op_count++;
	}
}